

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsregion.h
# Opt level: O0

void lslab_create(lslab *slab,size_t size,int64_t slab_id)

{
  size_t sVar1;
  int64_t slab_id_local;
  size_t size_local;
  lslab *slab_local;
  
  (slab->next_in_list).next = &slab->next_in_list;
  (slab->next_in_list).prev = &slab->next_in_list;
  slab->slab_size = size;
  sVar1 = lslab_sizeof();
  slab->slab_used = sVar1;
  slab->slab_id = slab_id;
  slab->max_id = -1;
  return;
}

Assistant:

static inline void
lslab_create(struct lslab *slab, size_t size, int64_t slab_id)
{
	rlist_create(&slab->next_in_list);
	slab->slab_size = size;
	slab->slab_used = lslab_sizeof();
	slab->slab_id = slab_id;
	slab->max_id = LSLAB_NOT_USED_ID;
}